

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
               sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  Rtree *pRVar3;
  RtreeSearchPoint *pRVar4;
  void *pvVar5;
  int *piVar6;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  double dVar7;
  RtreeSearchPoint *pNew;
  sqlite3_int64 iVal;
  int eType_1;
  RtreeConstraint *p_1;
  int eType;
  i64 iRowid;
  RtreeSearchPoint *p;
  int rc;
  int ii;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  i64 iNode;
  RtreeNode *pLeaf;
  int iCell;
  RtreeNode *pRoot;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Rtree *in_stack_ffffffffffffff50;
  sqlite3_int64 *in_stack_ffffffffffffff58;
  RtreeNode *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Rtree *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  i64 in_stack_ffffffffffffff80;
  Rtree *in_stack_ffffffffffffff88;
  int local_70;
  int local_6c;
  int local_2c;
  undefined1 *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar3 = (Rtree *)*in_RDI;
  rtreeReference(pRVar3);
  resetCursor((RtreeCursor *)in_stack_ffffffffffffff70);
  *(int *)((long)in_RDI + 0xc) = in_ESI;
  if (in_ESI == 1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    pRVar3 = (Rtree *)sqlite3_value_int64((sqlite3_value *)0x297b13);
    iVar2 = sqlite3_value_numeric_type((sqlite3_value *)in_stack_ffffffffffffff50);
    if (iVar2 == 1) {
LAB_00297b6c:
      local_70 = findLeafNode(in_stack_ffffffffffffff70,
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              &in_stack_ffffffffffffff60->pParent,in_stack_ffffffffffffff58);
    }
    else {
      if (iVar2 == 2) {
        sqlite3_value_double((sqlite3_value *)0x297b5a);
        iVar2 = sqlite3IntFloatCompare((i64)in_stack_ffffffffffffff58,(double)pRVar3);
        in_stack_ffffffffffffff50 = pRVar3;
        if (iVar2 == 0) goto LAB_00297b6c;
      }
      local_70 = 0;
      local_20 = (undefined1 *)0x0;
    }
    if ((local_70 == 0) && (local_20 != (undefined1 *)0x0)) {
      pRVar4 = rtreeSearchPointNew((RtreeCursor *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                   (RtreeDValue)in_stack_ffffffffffffff60,
                                   (u8)((ulong)in_stack_ffffffffffffff58 >> 0x38));
      in_RDI[0xb] = local_20;
      pRVar4->id = 0;
      pRVar4->eWithin = '\x01';
      local_70 = nodeRowidIndex((Rtree *)CONCAT44(in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68),
                                in_stack_ffffffffffffff60,(i64)in_stack_ffffffffffffff58,
                                (int *)in_stack_ffffffffffffff50);
      pRVar4->iCell = '\0';
    }
    else {
      *(undefined1 *)(in_RDI + 1) = 1;
    }
  }
  else {
    local_70 = nodeAcquire(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           (RtreeNode *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (RtreeNode **)in_stack_ffffffffffffff70);
    if ((local_70 == 0) && (0 < in_ECX)) {
      pvVar5 = sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      in_RDI[3] = pvVar5;
      *(int *)(in_RDI + 2) = in_ECX;
      if (in_RDI[3] == 0) {
        local_70 = 7;
      }
      else {
        memset((void *)in_RDI[3],0,(long)in_ECX * 0x18);
        memset(in_RDI + 0x10,0,(long)(pRVar3->iDepth + 1) << 2);
        for (local_6c = 0; local_6c < in_ECX; local_6c = local_6c + 1) {
          piVar6 = (int *)(in_RDI[3] + (long)local_6c * 0x18);
          in_stack_ffffffffffffff6c =
               sqlite3_value_numeric_type((sqlite3_value *)in_stack_ffffffffffffff50);
          piVar6[1] = (int)*(char *)(in_RDX + (local_6c << 1));
          *piVar6 = *(char *)(in_RDX + (local_6c * 2 + 1)) + -0x30;
          if (piVar6[1] < 0x46) {
            if (in_stack_ffffffffffffff6c == 1) {
              in_stack_ffffffffffffff60 =
                   (RtreeNode *)sqlite3_value_int64((sqlite3_value *)0x297e07);
              *(double *)(piVar6 + 2) = (double)(long)in_stack_ffffffffffffff60;
              if ((0xffffffffffff < (long)in_stack_ffffffffffffff60) ||
                 ((long)in_stack_ffffffffffffff60 < -0xffffffffffff)) {
                if (piVar6[1] == 0x43) {
                  piVar6[1] = 0x42;
                }
                if (piVar6[1] == 0x45) {
                  piVar6[1] = 0x44;
                }
              }
            }
            else if (in_stack_ffffffffffffff6c == 2) {
              dVar7 = sqlite3_value_double((sqlite3_value *)0x297e8b);
              *(double *)(piVar6 + 2) = dVar7;
            }
            else {
              piVar6[2] = 0;
              piVar6[3] = 0;
              if (in_stack_ffffffffffffff6c == 5) {
                piVar6[1] = 0x40;
              }
              else if ((piVar6[1] == 0x43) || (piVar6[1] == 0x42)) {
                piVar6[1] = 0x3f;
              }
              else {
                piVar6[1] = 0x40;
              }
            }
          }
          else {
            local_70 = deserializeGeometry((sqlite3_value *)
                                           CONCAT44(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68),
                                           (RtreeConstraint *)in_stack_ffffffffffffff60);
            if (local_70 != 0) break;
            *(uint *)(*(long *)(piVar6 + 4) + 0x38) = (uint)pRVar3->nDim2;
            *(undefined8 **)(*(long *)(piVar6 + 4) + 0x30) = in_RDI + 0x10;
            *(int *)(*(long *)(piVar6 + 4) + 0x40) = pRVar3->iDepth + 1;
          }
        }
      }
    }
    if (local_70 == 0) {
      pRVar4 = rtreeSearchPointNew((RtreeCursor *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                   (RtreeDValue)in_stack_ffffffffffffff60,0xaa);
      if (pRVar4 == (RtreeSearchPoint *)0x0) {
        local_2c = 7;
        goto LAB_00297fc9;
      }
      pRVar4->id = 1;
      pRVar4->iCell = '\0';
      pRVar4->eWithin = '\x01';
      in_RDI[0xb] = 0;
      local_70 = rtreeStepToLeaf((RtreeCursor *)in_stack_ffffffffffffff88);
    }
  }
  nodeRelease(in_stack_ffffffffffffff50,
              (RtreeNode *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  rtreeRelease((Rtree *)0x297fbe);
  local_2c = local_70;
LAB_00297fc9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

static int rtreeFilter(
  sqlite3_vtab_cursor *pVtabCursor,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int ii;
  int rc = SQLITE_OK;
  int iCell = 0;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  resetCursor(pCsr);

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    int eType = sqlite3_value_numeric_type(argv[0]);
    if( eType==SQLITE_INTEGER
     || (eType==SQLITE_FLOAT
         && 0==sqlite3IntFloatCompare(iRowid,sqlite3_value_double(argv[0])))
    ){
      rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    }else{
      rc = SQLITE_OK;
      pLeaf = 0;
    }
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array
    ** with the configured constraints.
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && argc>0 ){
      pCsr->aConstraint = sqlite3_malloc64(sizeof(RtreeConstraint)*argc);
      pCsr->nConstraint = argc;
      if( !pCsr->aConstraint ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*argc);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        assert( (idxStr==0 && argc==0)
                || (idxStr && (int)strlen(idxStr)==argc*2) );
        for(ii=0; ii<argc; ii++){
          RtreeConstraint *p = &pCsr->aConstraint[ii];
          int eType = sqlite3_value_numeric_type(argv[ii]);
          p->op = idxStr[ii*2];
          p->iCoord = idxStr[ii*2+1]-'0';
          if( p->op>=RTREE_MATCH ){
            /* A MATCH operator. The right-hand-side must be a blob that
            ** can be cast into an RtreeMatchArg object. One created using
            ** an sqlite3_rtree_geometry_callback() SQL user function.
            */
            rc = deserializeGeometry(argv[ii], p);
            if( rc!=SQLITE_OK ){
              break;
            }
            p->pInfo->nCoord = pRtree->nDim2;
            p->pInfo->anQueue = pCsr->anQueue;
            p->pInfo->mxLevel = pRtree->iDepth + 1;
          }else if( eType==SQLITE_INTEGER ){
            sqlite3_int64 iVal = sqlite3_value_int64(argv[ii]);
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = iVal;
#else
            p->u.rValue = (double)iVal;
            if( iVal>=((sqlite3_int64)1)<<48
             || iVal<=-(((sqlite3_int64)1)<<48)
            ){
              if( p->op==RTREE_LT ) p->op = RTREE_LE;
              if( p->op==RTREE_GT ) p->op = RTREE_GE;
            }
#endif
          }else if( eType==SQLITE_FLOAT ){
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = sqlite3_value_int64(argv[ii]);
#else
            p->u.rValue = sqlite3_value_double(argv[ii]);
#endif
          }else{
            p->u.rValue = RTREE_ZERO;
            if( eType==SQLITE_NULL ){
              p->op = RTREE_FALSE;
            }else if( p->op==RTREE_LT || p->op==RTREE_LE ){
              p->op = RTREE_TRUE;
            }else{
              p->op = RTREE_FALSE;
            }
          }
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      assert( pCsr->bPoint==0 );  /* Due to the resetCursor() call above */
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( NEVER(pNew==0) ){       /* Because pCsr->bPoint was FALSE */
        return SQLITE_NOMEM;
      }
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}